

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O2

void __thiscall
supermap::BloomFilter<supermap::Key<3UL>_>::reserve
          (BloomFilter<supermap::Key<3UL>_> *this,uint64_t numberOfElements)

{
  IllegalStateException *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  allocator<char> local_39;
  string local_38 [32];
  
  if (this->wasReserved_ != true) {
    auVar2._8_4_ = (int)(numberOfElements >> 0x20);
    auVar2._0_8_ = numberOfElements;
    auVar2._12_4_ = 0x45300000;
    this->wasReserved_ = true;
    dVar1 = ceil(((auVar2._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)numberOfElements) - 4503599627370496.0)) *
                 this->sizeMultiplier_);
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->elements_,
               (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1,false);
    return;
  }
  this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"Filter size has been already reserved",&local_39);
  supermap::IllegalStateException::IllegalStateException(this_00,local_38);
  __cxa_throw(this_00,&IllegalStateException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void reserve(std::uint64_t numberOfElements) override {
        if (wasReserved_) {
            throw supermap::IllegalStateException("Filter size has been already reserved");
        }
        wasReserved_ = true;
        auto size = static_cast<std::size_t>(std::ceil(static_cast<double>(numberOfElements) * sizeMultiplier_));
        elements_.resize(size);
    }